

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  TaskSet *pTVar1;
  Task *pTVar2;
  EventLoop *pEVar3;
  _func_int **pp_Var4;
  undefined8 *puVar5;
  long lVar6;
  long *plVar7;
  EventLoop *pEVar8;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  Event *extraout_RDX_02;
  Event *extraout_RDX_03;
  Event *extraout_RDX_04;
  Event *pEVar9;
  Event *extraout_RDX_05;
  EventLoop *in_RSI;
  Disposer *disposerCopy;
  Maybe<kj::Own<kj::_::Event>_> MVar10;
  Fault f;
  Runnable local_458;
  Exception EStack_450;
  NullableValue<kj::Exception> local_2f0;
  byte local_190;
  Exception local_188;
  undefined1 local_30;
  
  local_190 = 0;
  local_30 = 0;
  (*(code *)(*in_RSI[1].tail)->next)();
  local_458._vptr_Runnable = (_func_int **)&PTR_run_00629198;
  EStack_450.ownFile.content.ptr = (char *)in_RSI;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_2f0,&local_458);
  local_458._vptr_Runnable._0_1_ = local_2f0.isSet;
  pEVar9 = extraout_RDX;
  if (local_2f0.isSet == true) {
    EStack_450.ownFile.content.ptr = local_2f0.field_1.value.ownFile.content.ptr;
    EStack_450.ownFile.content.size_ = local_2f0.field_1.value.ownFile.content.size_;
    EStack_450.ownFile.content.disposer = local_2f0.field_1.value.ownFile.content.disposer;
    local_2f0.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_2f0.field_1.value.ownFile.content.size_ = 0;
    EStack_450.file = local_2f0.field_1.value.file;
    EStack_450.line = local_2f0.field_1.value.line;
    EStack_450.type = local_2f0.field_1.value.type;
    EStack_450.description.content.ptr = local_2f0.field_1.value.description.content.ptr;
    EStack_450.description.content.size_ = local_2f0.field_1.value.description.content.size_;
    local_2f0.field_1.value.description.content.ptr = (char *)0x0;
    local_2f0.field_1.value.description.content.size_ = 0;
    EStack_450.description.content.disposer = local_2f0.field_1.value.description.content.disposer;
    EStack_450.context.ptr.disposer = local_2f0.field_1.value.context.ptr.disposer;
    EStack_450.context.ptr.ptr = local_2f0.field_1.value.context.ptr.ptr;
    local_2f0.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(EStack_450.trace,(void *)((long)&local_2f0.field_1 + 0x50),0x104);
    Exception::~Exception(&local_2f0.field_1.value);
    pEVar9 = extraout_RDX_00;
    local_2f0.isSet = (bool)(byte)local_458._vptr_Runnable;
  }
  if ((local_2f0.isSet & 1U) != 0) {
    if ((local_190 & 1) == 0) {
      local_188.ownFile.content.ptr = EStack_450.ownFile.content.ptr;
      local_188.ownFile.content.size_ = EStack_450.ownFile.content.size_;
      local_188.ownFile.content.disposer = EStack_450.ownFile.content.disposer;
      EStack_450.ownFile.content.ptr = (char *)0x0;
      EStack_450.ownFile.content.size_ = 0;
      local_188.file = EStack_450.file;
      local_188.line = EStack_450.line;
      local_188.type = EStack_450.type;
      local_188.description.content.ptr = EStack_450.description.content.ptr;
      local_188.description.content.size_ = EStack_450.description.content.size_;
      EStack_450.description.content.ptr = (char *)0x0;
      EStack_450.description.content.size_ = 0;
      local_188.description.content.disposer = EStack_450.description.content.disposer;
      local_188.context.ptr.disposer = EStack_450.context.ptr.disposer;
      local_188.context.ptr.ptr = EStack_450.context.ptr.ptr;
      EStack_450.context.ptr.ptr = (Context *)0x0;
      memcpy(local_188.trace,EStack_450.trace,0x104);
      local_190 = 1;
    }
    Exception::~Exception(&EStack_450);
    pEVar9 = extraout_RDX_01;
  }
  if ((local_190 & 1) != 0) {
    (*(code *)**(undefined8 **)**(undefined8 **)&in_RSI[1].running)
              ((undefined8 *)**(undefined8 **)&in_RSI[1].running,&local_188);
    pEVar9 = extraout_RDX_02;
  }
  pTVar1 = (in_RSI->daemons).ptr;
  pTVar2 = (Task *)in_RSI[1].port;
  if (pTVar1 != (TaskSet *)0x0) {
    pTVar1[1].tasks.ptr.ptr = pTVar2;
  }
  if ((pTVar2 != (Task *)0x0) && (pEVar3 = (pTVar2->super_Event).loop, pEVar3 != (EventLoop *)0x0))
  {
    pp_Var4 = (pTVar2->super_Event)._vptr_Event;
    (pTVar2->super_Event).loop = (EventLoop *)0x0;
    if (pEVar3 == in_RSI) {
      pEVar8 = (EventLoop *)(in_RSI->daemons).ptr;
      (pTVar2->super_Event)._vptr_Event = (_func_int **)(in_RSI->daemons).disposer;
      (pTVar2->super_Event).loop = pEVar8;
      (in_RSI->daemons).disposer = (Disposer *)0x0;
      (in_RSI->daemons).ptr = (TaskSet *)0x0;
      puVar5 = *(undefined8 **)(*(long *)&in_RSI[1].running + 0x20);
      in_RSI[1].port = (EventPort *)0x0;
      if ((puVar5 != (undefined8 *)0x0) && (*(long *)(*(long *)&in_RSI[1].running + 0x10) == 0)) {
        (**(code **)*puVar5)(puVar5,&local_458);
        lVar6 = *(long *)&in_RSI[1].running;
        puVar5 = *(undefined8 **)(lVar6 + 0x18);
        plVar7 = *(long **)(lVar6 + 0x20);
        *(undefined8 *)(lVar6 + 0x18) = 0;
        *(undefined8 *)(lVar6 + 0x20) = 0;
        pEVar9 = extraout_RDX_03;
        if (plVar7 != (long *)0x0) {
          (**(code **)*puVar5)(puVar5,(long)plVar7 + *(long *)(*plVar7 + -0x10));
          pEVar9 = extraout_RDX_04;
        }
      }
      (this->super_Event)._vptr_Event = pp_Var4;
      (this->super_Event).loop = pEVar3;
      if (local_190 == 1) {
        Exception::~Exception(&local_188);
        pEVar9 = extraout_RDX_05;
      }
      MVar10.ptr.ptr = pEVar9;
      MVar10.ptr.disposer = (Disposer *)this;
      return (Maybe<kj::Own<kj::_::Event>_>)MVar10.ptr;
    }
    local_2f0.isSet = false;
    local_2f0._1_7_ = 0;
    local_458._vptr_Runnable = (_func_int **)0x0;
    EStack_450.ownFile.content.ptr = (char *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2f0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2f0);
  }
  local_2f0.isSet = false;
  local_2f0._1_7_ = 0;
  local_458._vptr_Runnable = (_func_int **)0x0;
  EStack_450.ownFile.content.ptr = (char *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_2f0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_2f0);
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(*exception));
    }

    // Call the error handler if there was an exception.
    KJ_IF_MAYBE(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(*e));
    }

    // Remove from the task list.
    KJ_IF_MAYBE(n, next) {
      n->get()->prev = prev;
    }
    Own<Event> self = kj::mv(KJ_ASSERT_NONNULL(*prev));
    KJ_ASSERT(self.get() == this);
    *prev = kj::mv(next);
    next = nullptr;
    prev = nullptr;

    KJ_IF_MAYBE(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == nullptr) {
        f->get()->fulfill();
        taskSet.emptyFulfiller = nullptr;
      }
    }

    return mv(self);
  }